

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool findKeyPresses<short>
               (TWaveformViewT<short> *waveform,TKeyPressCollectionT<short> *res,
               TWaveformT<short> *waveformThreshold,TWaveformT<short> *waveformMax,
               double thresholdBackground,int historySize,int historySizeReset,bool removeLowPower)

{
  short sVar1;
  short *psVar2;
  size_type __n;
  pointer psVar3;
  value_type *__x;
  long lVar4;
  long lVar5;
  pointer psVar6;
  _Elt_pointer plVar7;
  long lVar8;
  size_type sVar9;
  long lVar10;
  pointer psVar11;
  size_type sVar12;
  TKeyPressCollectionT<short> *__range3;
  int iVar13;
  iterator __end0;
  short sVar14;
  iterator __begin0_1;
  long lVar15;
  int i;
  size_type __n_00;
  pointer psVar16;
  int iVar17;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  long local_140;
  double local_138;
  vector<short,_std::allocator<short>_> *local_130;
  int local_124;
  TWaveformT<short> waveformAbs;
  type tmp;
  deque<long,_std::allocator<long>_> que;
  vector<double,_std::allocator<double>_> rbSamples;
  undefined1 auVar18 [16];
  
  psVar16 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_finish != psVar16) {
    (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
    super__Vector_impl_data._M_finish = psVar16;
  }
  local_130 = waveformMax;
  local_124 = historySizeReset;
  std::vector<short,_std::allocator<short>_>::resize(waveformThreshold,waveform->n);
  std::vector<short,_std::allocator<short>_>::resize(local_130,waveform->n);
  que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&rbSamples,(long)(historySize * 8),(value_type_conflict5 *)&que,(allocator_type *)&tmp)
  ;
  __n_00 = (size_type)historySize;
  std::deque<long,_std::allocator<long>_>::deque(&que,__n_00,(allocator_type *)&tmp);
  psVar2 = waveform->samples;
  __n = waveform->n;
  std::vector<short,_std::allocator<short>_>::vector(&waveformAbs,__n,(allocator_type *)&tmp);
  sVar9 = 0;
  sVar12 = 0;
  if (0 < (long)__n) {
    sVar12 = __n;
  }
  for (; sVar12 != sVar9; sVar9 = sVar9 + 1) {
    sVar1 = psVar2[sVar9];
    sVar14 = -sVar1;
    if (0 < sVar1) {
      sVar14 = sVar1;
    }
    waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start[sVar9] = sVar14;
  }
  local_138 = 0.0;
  local_140 = 0;
  iVar13 = 0;
  do {
    if ((long)__n <= local_140) {
      if (removeLowPower) {
        do {
          psVar16 = (res->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar3 = (res->
                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar10 = (long)psVar3 - (long)psVar16;
          dVar21 = 0.0;
          for (psVar11 = psVar16; psVar11 != psVar3; psVar11 = psVar11 + 1) {
            dVar21 = dVar21 + (double)(int)waveformAbs.
                                           super__Vector_base<short,_std::allocator<short>_>._M_impl
                                           .super__Vector_impl_data._M_start[psVar11->pos];
          }
          lVar8 = lVar10 / 0x30;
          auVar19._8_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar19._0_8_ = lVar8;
          auVar19._12_4_ = 0x45300000;
          tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl
          .super__Vector_impl_data._M_finish._0_4_ = SUB84(psVar3,0);
          tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl
          .super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)psVar3 >> 0x20);
          psVar11 = (res->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(psVar11,0);
          tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)psVar11 >> 0x20);
          (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          tmp.nClusters = res->nClusters;
          local_138 = (dVar21 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) *
                      0.3;
          tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl
          .super__Vector_impl_data._M_start = psVar16;
          for (; psVar16 != psVar3; psVar16 = psVar16 + 1) {
            if (local_138 <
                (double)(int)waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                             super__Vector_impl_data._M_start[psVar16->pos]) {
              std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::push_back
                        (&res->
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ,psVar16);
            }
          }
          psVar16 = (res->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          psVar3 = (res->
                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::_Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
          ~_Vector_base((_Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         *)&tmp);
        } while ((long)psVar16 - (long)psVar3 != lVar10);
      }
      __x = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
      lVar10 = 0x30;
      if (1 < (ulong)(((long)(res->
                             super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                             ).
                             super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)__x) / 0x30)) {
        tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        tmp.nClusters = 0;
        tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::push_back
                  (&tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                   ,__x);
        lVar15 = (long)local_124;
        for (lVar8 = 1;
            psVar16 = (res->
                      super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            lVar8 < (int)(((long)(res->
                                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 ).
                                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar16) / 0x30)
            ; lVar8 = lVar8 + 1) {
          lVar4 = *(long *)((long)&psVar16->pos + lVar10);
          lVar5 = *(long *)(CONCAT44(tmp.
                                     super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     .
                                     super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     tmp.
                                     super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     .
                                     super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._0_4_) + -0x20);
          if ((lVar15 < lVar4 - lVar5) ||
             (psVar6 = (local_130->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                       super__Vector_impl_data._M_start, psVar6[lVar5] < psVar6[lVar4])) {
            std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::push_back
                      (&tmp.
                        super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       ,(value_type *)((long)&(psVar16->waveform).samples + lVar10));
          }
          lVar10 = lVar10 + 0x30;
        }
        std::swap<stKeyPressCollection<short>>(res,&tmp);
        std::_Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
        ~_Vector_base((_Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       *)&tmp);
      }
      std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
                (&waveformAbs.super__Vector_base<short,_std::allocator<short>_>);
      std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base
                (&que.super__Deque_base<long,_std::allocator<long>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&rbSamples.super__Vector_base<double,_std::allocator<double>_>);
      return true;
    }
    if (historySize / 2 <= local_140) {
      lVar10 = (long)rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      auVar18._8_4_ =
           (int)((long)rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 0x23);
      auVar18._0_8_ = lVar10;
      auVar18._12_4_ = 0x45300000;
      iVar17 = (int)lVar10;
      dVar20 = (auVar18._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,iVar17) - 4503599627370496.0);
      dVar21 = rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar13];
      sVar1 = waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_start[local_140];
      rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar13] = (double)(int)sVar1;
      local_138 = ((local_138 * dVar20 - dVar21) + (double)(int)sVar1) / dVar20;
      iVar13 = iVar13 + 1;
      if (iVar17 <= iVar13) {
        iVar13 = 0;
      }
    }
    if (local_140 < (long)__n_00) {
      while (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur !=
             que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur) {
        plVar7 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
                 _M_finish._M_cur;
        if (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_cur ==
            que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_first) {
          plVar7 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data
                   ._M_finish._M_node[-1] + 0x40;
        }
        if (waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start[local_140] <
            waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start[plVar7[-1]]) break;
        std::deque<long,_std::allocator<long>_>::pop_back(&que);
      }
      std::deque<long,_std::allocator<long>_>::push_back(&que,&local_140);
    }
    else {
      while( true ) {
        if ((que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur ==
             que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur) ||
           ((long)(local_140 - __n_00) <
            *que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur)) break;
        std::deque<long,_std::allocator<long>_>::pop_front(&que);
      }
      while (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur !=
             que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur) {
        plVar7 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
                 _M_finish._M_cur;
        if (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_cur ==
            que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_first) {
          plVar7 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data
                   ._M_finish._M_node[-1] + 0x40;
        }
        if (waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start[local_140] <
            waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start[plVar7[-1]]) break;
        std::deque<long,_std::allocator<long>_>::pop_back(&que);
      }
      std::deque<long,_std::allocator<long>_>::push_back(&que,&local_140);
      psVar16 = (pointer)(local_140 - historySize / 2);
      if ((((long)psVar16 < (long)(__n - (long)(historySize * 2)) &&
            (long)(historySize * 2) <= (long)psVar16) &&
          ((pointer)*que.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur == psVar16)) &&
         (local_138 * thresholdBackground <
          (double)(int)waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)psVar16])) {
        tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)waveform->samples;
        tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = (undefined4)waveform->n;
        tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)waveform->n >> 0x20);
        tmp.nClusters = 0;
        tmp._28_4_ = 0;
        tmp.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = psVar16;
        std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
        emplace_back<stKeyPressData<short>>
                  ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)res,
                   (stKeyPressData<short> *)&tmp);
      }
      (waveformThreshold->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
      super__Vector_impl_data._M_start[(long)psVar16] =
           (short)(int)(local_138 * thresholdBackground);
      (local_130->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data
      ._M_start[(long)psVar16] =
           waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start
           [*que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur];
    }
    local_140 = local_140 + 1;
  } while( true );
}

Assistant:

bool findKeyPresses(
        const TWaveformViewT<T> & waveform,
        TKeyPressCollectionT<T> & res,
        TWaveformT<T> & waveformThreshold,
        TWaveformT<T> & waveformMax,
        double thresholdBackground,
        int historySize,
        int historySizeReset,
        bool removeLowPower) {
    res.clear();
    waveformThreshold.resize(waveform.n);
    waveformMax.resize(waveform.n);

    int rbBegin = 0;
    double rbAverage = 0.0;
    std::vector<double> rbSamples(8*historySize, 0.0);

    int k = historySize;
    std::deque<int64_t> que(k);

    auto samples = waveform.samples;
    auto n       = waveform.n;

    TWaveformT<T> waveformAbs(n);
    for (int64_t i = 0; i < n; ++i) {
        waveformAbs[i] = std::abs(samples[i]);
    }

    for (int64_t i = 0; i < n; ++i) {
        {
            int64_t ii = i - k/2;
            if (ii >= 0) {
                rbAverage *= rbSamples.size();
                rbAverage -= rbSamples[rbBegin];
                double acur = waveformAbs[i];
                rbSamples[rbBegin] = acur;
                rbAverage += acur;
                rbAverage /= rbSamples.size();
                if (++rbBegin >= (int) rbSamples.size()) {
                    rbBegin = 0;
                }
            }
        }

        if (i < k) {
            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }
            que.push_back(i);
        } else {
            while((!que.empty()) && que.front() <= i - k) {
                que.pop_front();
            }

            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }

            que.push_back(i);

            int64_t itest = i - k/2;
            if (itest >= 2*k && itest < n - 2*k && que.front() == itest) {
                double acur = waveformAbs[itest];
                if (acur > thresholdBackground*rbAverage) {
                    res.emplace_back(TKeyPressDataT<T> { std::move(waveform), itest, 0.0, -1, -1, '?' });
                }
            }
            waveformThreshold[itest] = thresholdBackground*rbAverage;
            waveformMax[itest] = waveformAbs[que.front()];
        }
    }

    if (removeLowPower) {
        while (true) {
            auto oldn = res.size();

            double avgPower = 0.0;
            for (const auto & kp : res) {
                avgPower += waveformAbs[kp.pos];
            }
            avgPower /= res.size();

            auto tmp = std::move(res);
            for (const auto & kp : tmp) {
                if (waveformAbs[kp.pos] > 0.3*avgPower) {
                    res.push_back(kp);
                }
            }

            if (res.size() == oldn) break;
        }
    }

    if (res.size() > 1) {
        TKeyPressCollectionT<T> res2;
        res2.push_back(res.front());

        for (int i = 1; i < (int) res.size(); ++i) {
            if (res[i].pos - res2.back().pos > historySizeReset || waveformMax[res[i].pos] > waveformMax[res2.back().pos]) {
                res2.push_back(res[i]);
            }
        }

        std::swap(res, res2);
    }

    return true;
}